

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwen2vl-cli.cpp
# Opt level: O1

llava_context * llava_init_context(common_params *params,llama_model *model)

{
  char *fname;
  pointer pcVar1;
  clip_ctx *pcVar2;
  llama_context *plVar3;
  llava_context *plVar4;
  common_log *log;
  long lVar5;
  llama_context_params *plVar6;
  undefined8 *puVar7;
  byte bVar8;
  string prompt;
  llama_context_params ctx_params;
  undefined8 auStack_138 [15];
  long *local_c0;
  long local_b8;
  long local_b0 [2];
  llama_context_params local_a0;
  
  bVar8 = 0;
  fname = (params->mmproj).path._M_dataplus._M_p;
  pcVar1 = (params->prompt)._M_dataplus._M_p;
  local_c0 = local_b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + (params->prompt)._M_string_length);
  if (local_b8 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_c0,0,(char *)0x0,0x239371);
  }
  pcVar2 = clip_model_load(fname,2);
  common_context_params_to_llama(&local_a0,params);
  local_a0.n_ctx = 0x800;
  if (0x800 < params->n_ctx) {
    local_a0.n_ctx = params->n_ctx;
  }
  plVar6 = &local_a0;
  puVar7 = auStack_138;
  for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *(undefined8 *)plVar6;
    plVar6 = (llama_context_params *)((long)plVar6 + ((ulong)bVar8 * -2 + 1) * 8);
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  plVar3 = (llama_context *)llama_init_from_model(model);
  if (plVar3 == (llama_context *)0x0) {
    if (common_log_verbosity_thold < 0) {
      plVar4 = (llava_context *)0x0;
    }
    else {
      log = common_log_main();
      plVar4 = (llava_context *)0x0;
      common_log_add(log,GGML_LOG_LEVEL_ERROR,"%s: failed to create the llama_context\n",
                     "llava_init_context");
    }
  }
  else {
    plVar4 = (llava_context *)malloc(0x18);
    plVar4->ctx_llama = plVar3;
    plVar4->ctx_clip = pcVar2;
    plVar4->model = model;
  }
  if (local_c0 != local_b0) {
    operator_delete(local_c0,local_b0[0] + 1);
  }
  return plVar4;
}

Assistant:

static struct llava_context * llava_init_context(common_params * params, llama_model * model) {
    const char * clip_path = params->mmproj.path.c_str();

    auto prompt = params->prompt;
    if (prompt.empty()) {
        prompt = "describe the image in detail.";
    }

    auto ctx_clip = clip_model_load(clip_path, GGML_LOG_LEVEL_INFO);

    llama_context_params ctx_params = common_context_params_to_llama(*params);
    ctx_params.n_ctx           = params->n_ctx < 2048 ? 2048 : params->n_ctx; // we need a longer context size to process image embeddings

    llama_context * ctx_llama = llama_init_from_model(model, ctx_params);

    if (ctx_llama == NULL) {
        LOG_ERR("%s: failed to create the llama_context\n" , __func__);
        return NULL;
    }

    auto * ctx_llava = (struct llava_context *)malloc(sizeof(llava_context));

    ctx_llava->ctx_llama = ctx_llama;
    ctx_llava->ctx_clip = ctx_clip;
    ctx_llava->model = model;
    return ctx_llava;
}